

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O1

void __thiscall
Rml::ElementFormControlTextArea::SetWordWrapProperties(ElementFormControlTextArea *this)

{
  bool bVar1;
  Property local_70;
  
  bVar1 = GetWordWrap(this);
  local_70.value.type = NONE;
  Variant::Set(&local_70.value,2 - (uint)bVar1);
  local_70.unit = KEYWORD;
  local_70.specificity = -1;
  local_70.definition = (PropertyDefinition *)0x0;
  local_70.parser_index = -1;
  local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty((Element *)this,OverflowX,&local_70);
  if (local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.source.
               super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  Variant::~Variant(&local_70.value);
  local_70.value.type = NONE;
  Variant::Set(&local_70.value,2);
  local_70.unit = KEYWORD;
  local_70.specificity = -1;
  local_70.definition = (PropertyDefinition *)0x0;
  local_70.parser_index = -1;
  local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty((Element *)this,OverflowY,&local_70);
  if (local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.source.
               super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  Variant::~Variant(&local_70.value);
  local_70.value.type = NONE;
  Variant::Set(&local_70.value,(uint)bVar1 * 2 + 1);
  local_70.unit = KEYWORD;
  local_70.specificity = -1;
  local_70.definition = (PropertyDefinition *)0x0;
  local_70.parser_index = -1;
  local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty((Element *)this,WhiteSpace,&local_70);
  if (local_70.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.source.
               super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  Variant::~Variant(&local_70.value);
  return;
}

Assistant:

void ElementFormControlTextArea::SetWordWrapProperties()
{
	const bool word_wrap = GetWordWrap();
	SetProperty(PropertyId::OverflowX, Property(word_wrap ? Style::Overflow::Hidden : Style::Overflow::Auto));
	SetProperty(PropertyId::OverflowY, Property(Style::Overflow::Auto));
	SetProperty(PropertyId::WhiteSpace, Property(word_wrap ? Style::WhiteSpace::Prewrap : Style::WhiteSpace::Pre));
}